

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_formats.c
# Opt level: O1

FMStructDescList get_localized_formats_dill(FMFormat f,dill_stream_conflict s)

{
  FMStructDescList subformats;
  long lVar1;
  ulong uVar2;
  FMStructDescList subformats_00;
  ulong uVar3;
  
  for (uVar2 = 0;
      (f->subformats != (FMFormat_conflict *)0x0 && (f->subformats[uVar2] != (FMFormat_conflict)0x0)
      ); uVar2 = uVar2 + 1) {
  }
  uVar3 = uVar2 & 0xffffffff;
  subformats = (FMStructDescList)ffs_malloc(uVar3 * 0x20 + 0x40);
  subformats[uVar3 + 1].opt_info = (FMOptInfo *)0x0;
  subformats[uVar3 + 1].format_name = (char *)0x0;
  subformats[uVar3 + 1].field_list = (FMFieldList)0x0;
  subformats[uVar3 + 1].struct_size = 0;
  if ((int)uVar2 != 0) {
    lVar1 = (long)(int)uVar2;
    subformats_00 = subformats + lVar1;
    do {
      lVar1 = lVar1 + -1;
      generate_localized_subformat(f->subformats[lVar1],subformats_00,s);
      subformats_00 = subformats_00 + -1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  generate_localized_subformat(f,subformats,s);
  return subformats;
}

Assistant:

extern FMStructDescList
get_localized_formats_dill(FMFormat f, dill_stream s)
{
    FMStructDescList ret_list;
    int subformat_count = 0;
    while(f->subformats && (f->subformats[subformat_count] != NULL)) {
	subformat_count++;
    }
    ret_list = malloc(sizeof(ret_list[0]) * (subformat_count+2));
    int i = 0;
    ret_list[subformat_count+1].format_name = NULL;
    ret_list[subformat_count+1].field_list = NULL;
    ret_list[subformat_count+1].struct_size = 0;
    ret_list[subformat_count+1].opt_info = 0;
    for (i=0; i < subformat_count; i++) {
	generate_localized_subformat(f->subformats[subformat_count-i-1], &ret_list[subformat_count - i], s);
    }
    generate_localized_subformat(f, ret_list, s);
    return ret_list;
}